

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void bhdct_get(planck_unit_test_t *tc,ion_dictionary_t *dict,ion_key_t key,
              ion_value_t expected_value,ion_err_t expected_status,ion_result_count_t expected_count
              )

{
  undefined8 uVar1;
  long lVar2;
  ion_key_t key_00;
  planck_unit_test_t *state;
  ion_value_t __s1;
  int32_t expected;
  ion_result_count_t expected_00;
  planck_unit_result_t pVar3;
  int actual;
  ion_status_t iVar4;
  int line;
  size_t sVar5;
  undefined7 in_register_00000081;
  undefined1 *__s;
  ulong uVar6;
  undefined1 *__s_00;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  ion_key_t local_50;
  planck_unit_test_t *local_48;
  ion_value_t local_40;
  int32_t local_38;
  ion_result_count_t local_34;
  
  local_34 = expected_count;
  local_38 = (int32_t)CONCAT71(in_register_00000081,expected_status);
  local_40 = expected_value;
  local_50 = key;
  local_48 = tc;
  sVar5 = (size_t)(dict->instance->record).value_size;
  uVar6 = sVar5 + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar6;
  __s = auStack_58 + lVar2;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x76;
  uVar1 = *(undefined8 *)((long)&uStack_60 + lVar2);
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x10159c;
  memset(__s,(int)uVar1,sVar5);
  __s_00 = __s + -uVar6;
  *(undefined8 *)(__s_00 + -8) = 0x76;
  state = local_48;
  uVar1 = *(undefined8 *)(__s_00 + -8);
  *(undefined8 *)(__s_00 + -8) = 0x1015b7;
  memset(__s_00,(int)uVar1,sVar5);
  key_00 = local_50;
  *(undefined8 *)(__s_00 + -8) = 0x1015c6;
  iVar4 = dictionary_get(dict,key_00,__s_00);
  expected = local_38;
  *(undefined8 *)(__s_00 + -8) = 0x1015e4;
  pVar3 = planck_unit_assert_int_are_equal
                    (state,expected,(int)iVar4.error,0xad,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  expected_00 = local_34;
  if (pVar3 != '\0') {
    *(undefined8 *)(__s_00 + -8) = 0x10160a;
    pVar3 = planck_unit_assert_int_are_equal
                      (state,expected_00,iVar4.count,0xae,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                      );
    __s1 = local_40;
    if (pVar3 != '\0') {
      sVar5 = (size_t)(dict->instance->record).value_size;
      if (((ulong)iVar4 & 0xff) == 0) {
        *(undefined8 *)(__s_00 + -8) = 0x101648;
        actual = memcmp(__s1,__s_00,sVar5);
        line = 0xb1;
      }
      else {
        *(undefined8 *)(__s_00 + -8) = 0x101627;
        actual = memcmp(__s,__s_00,sVar5);
        line = 0xb5;
      }
      *(undefined8 *)(__s_00 + -8) = 0x101660;
      pVar3 = planck_unit_assert_int_are_equal
                        (state,0,actual,line,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                        );
      if (pVar3 != '\0') {
        return;
      }
    }
  }
  *(undefined8 *)(__s_00 + -8) = 1;
  uVar1 = *(undefined8 *)(__s_00 + -8);
  *(code **)(__s_00 + -8) = bhdct_insert;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,(int)uVar1);
}

Assistant:

void
bhdct_get(
	planck_unit_test_t	*tc,
	ion_dictionary_t	*dict,
	ion_key_t			key,
	ion_value_t			expected_value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count
) {
	ion_value_t defaultval = alloca(dict->instance->record.value_size);

	memset(defaultval, 0x76, dict->instance->record.value_size);

	ion_value_t retval = alloca(dict->instance->record.value_size);

	memcpy(retval, defaultval, dict->instance->record.value_size);

	ion_status_t status = dictionary_get(dict, key, retval);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(expected_value, retval, dict->instance->record.value_size));
	}
	else {
		/* Here, we check to see that the passed in space to write the value remains unchanged, if we have an error condition. */
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(defaultval, retval, dict->instance->record.value_size));
	}
}